

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::ServiceOptions::MergePartialFromCodedStream
          (ServiceOptions *this,CodedInputStream *input)

{
  Message *containing_type;
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  WireType WVar4;
  UninterpretedOption *value;
  UnknownFieldSet *pUVar5;
  uint32 tag;
  CodedInputStream *input_local;
  ServiceOptions *this_local;
  uint32 local_20;
  
  do {
    while( true ) {
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
        input->last_tag_ = (uint)*input->buffer_;
        io::CodedInputStream::Advance(input,1);
        local_20 = input->last_tag_;
      }
      else {
        uVar2 = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = uVar2;
        local_20 = input->last_tag_;
      }
      if (local_20 == 0) {
        return true;
      }
      iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_20);
      if ((iVar3 == 999) &&
         (WVar4 = internal::WireFormatLite::GetTagWireType(local_20),
         WVar4 == WIRETYPE_LENGTH_DELIMITED)) break;
      WVar4 = internal::WireFormatLite::GetTagWireType(local_20);
      containing_type = default_instance_;
      if (WVar4 == WIRETYPE_END_GROUP) {
        return true;
      }
      if (local_20 < 8000) {
        pUVar5 = mutable_unknown_fields(this);
        bVar1 = internal::WireFormat::SkipField(input,local_20,pUVar5);
        if (!bVar1) {
          return false;
        }
      }
      else {
        pUVar5 = mutable_unknown_fields(this);
        bVar1 = internal::ExtensionSet::ParseField
                          (&this->_extensions_,local_20,input,containing_type,pUVar5);
        if (!bVar1) {
          return false;
        }
      }
    }
    do {
      value = add_uninterpreted_option(this);
      bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::UninterpretedOption>
                        (input,value);
      if (!bVar1) {
        return false;
      }
      iVar3 = io::CodedInputStream::BufferSize(input);
      if (((iVar3 < 2) || (*input->buffer_ != 0xba)) || (input->buffer_[1] != '>')) {
        bVar1 = false;
      }
      else {
        io::CodedInputStream::Advance(input,2);
        bVar1 = true;
      }
    } while (bVar1);
    bVar1 = io::CodedInputStream::ExpectAtEnd(input);
  } while (!bVar1);
  return true;
}

Assistant:

bool ServiceOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}